

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3f>
               (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *src,
               vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float fVar4;
  uint uVar5;
  pointer pmVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  pointer puVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  __node_base _Var15;
  float fVar16;
  size_type __n;
  long lVar17;
  bool bVar18;
  uint32_t vidx;
  unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
  vdata;
  value_type local_8c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)0x0) {
    bVar18 = false;
  }
  else {
    uVar11 = (long)(faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    bVar18 = false;
    if ((((long)(src->
                super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(src->
                super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7 - uVar11 == 0
        ) && (2 < uVar11)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar12 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      bVar18 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish == puVar12;
      if (bVar18) {
        __n = 1;
      }
      else {
        lVar17 = 0;
        uVar11 = 0;
        fVar16 = 0.0;
        do {
          fVar4 = (float)puVar12[uVar11];
          local_8c.m[0][0] = fVar4;
          if ((uint)fVar16 < (uint)fVar4) {
            fVar16 = fVar4;
          }
          sVar13 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(&local_68,(key_type_conflict1 *)&local_8c);
          if (sVar13 == 0) {
            pmVar6 = (src->
                     super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar14 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&local_68,(key_type *)&local_8c);
            puVar3 = (undefined8 *)((long)pmVar6->m[0] + lVar17);
            uVar7 = puVar3[1];
            puVar1 = (undefined8 *)((long)pmVar6->m[1] + lVar17 + 4U);
            uVar8 = *puVar1;
            uVar9 = puVar1[1];
            *(undefined8 *)pmVar14->m[0] = *puVar3;
            *(undefined8 *)(pmVar14->m[0] + 2) = uVar7;
            *(undefined8 *)(pmVar14->m[1] + 1) = uVar8;
            *(undefined8 *)pmVar14->m[2] = uVar9;
            pmVar14->m[2][2] = *(float *)((long)pmVar6->m[2] + lVar17 + 8U);
          }
          else {
            pmVar14 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&local_68,(key_type *)&local_8c);
            bVar10 = is_close(pmVar14,(matrix3f *)
                                      ((long)((src->
                                              super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->m[0] +
                                      lVar17),1.1920929e-07);
            if (!bVar10) goto LAB_00389efd;
          }
          uVar11 = uVar11 + 1;
          puVar12 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x24;
          bVar10 = uVar11 < (ulong)((long)(faceVertexIndices->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar12 >> 2);
          bVar18 = !bVar10;
        } while (bVar10);
        __n = (size_type)((int)fVar16 + 1);
      }
      local_8c.m[0][0] = 1.0;
      local_8c.m[0][1] = 0.0;
      local_8c.m[0][2] = 0.0;
      local_8c.m[1][0] = 0.0;
      local_8c.m[1][1] = 1.0;
      local_8c.m[1][2] = 0.0;
      local_8c.m[2][0] = 0.0;
      local_8c.m[2][1] = 0.0;
      local_8c.m[2][2] = 1.0;
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      _M_fill_assign(dst,__n,&local_8c);
      for (_Var15._M_nxt = local_68._M_before_begin._M_nxt; _Var15._M_nxt != (_Hash_node_base *)0x0;
          _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
        uVar5 = *(uint *)&_Var15._M_nxt[1]._M_nxt;
        pmVar6 = (dst->
                 super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pmVar6[uVar5].m[2][2] = *(float *)((long)&_Var15._M_nxt[5]._M_nxt + 4);
        uVar7 = *(undefined8 *)((long)&_Var15._M_nxt[4]._M_nxt + 4);
        pfVar2 = pmVar6[uVar5].m[1] + 1;
        *(undefined8 *)pfVar2 = *(undefined8 *)((long)&_Var15._M_nxt[3]._M_nxt + 4);
        *(undefined8 *)(pfVar2 + 2) = uVar7;
        uVar7 = *(undefined8 *)((long)&_Var15._M_nxt[2]._M_nxt + 4);
        *(undefined8 *)pmVar6[uVar5].m[0] = *(undefined8 *)((long)&_Var15._M_nxt[1]._M_nxt + 4);
        *(undefined8 *)(pmVar6[uVar5].m[0] + 2) = uVar7;
      }
LAB_00389efd:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar18;
}

Assistant:

bool TryConvertFacevaryingToVertexMat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->assign(max_vidx + 1, T::identity());

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}